

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int intern_device_id(cubeb_conflict *ctx,char **id)

{
  char *pcVar1;
  cubeb_strings *in_RSI;
  long in_RDI;
  char *interned;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == 0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                  ,0x95,"int intern_device_id(cubeb *, const char **)");
  }
  if (in_RSI != (cubeb_strings *)0x0) {
    pcVar1 = cubeb_strings_intern(in_RSI,in_stack_ffffffffffffffe0);
    if (pcVar1 == (char *)0x0) {
      local_4 = -1;
    }
    else {
      *(char **)in_RSI = pcVar1;
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("id",
                "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                ,0x96,"int intern_device_id(cubeb *, const char **)");
}

Assistant:

static int
intern_device_id(cubeb * ctx, char const ** id)
{
  char const * interned;

  assert(ctx);
  assert(id);

  interned = cubeb_strings_intern(ctx->device_ids, *id);
  if (!interned) {
    return CUBEB_ERROR;
  }

  *id = interned;

  return CUBEB_OK;
}